

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_fast.c
# Opt level: O1

void lzma_lzma_optimum_fast
               (lzma_lzma1_encoder *coder,lzma_mf *mf,uint32_t *back_res,uint32_t *len_res)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  lzma_mf *plVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int iVar7;
  undefined4 extraout_var;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint32_t *puVar11;
  uint32_t *puVar12;
  ulong uVar13;
  uint8_t *puVar14;
  lzma_lzma1_encoder *plVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong unaff_R13;
  short *psVar19;
  size_t __n;
  long lVar20;
  bool bVar21;
  uint32_t matches_count;
  uint32_t local_8c;
  uint32_t *local_88;
  uint32_t *local_80;
  uint32_t local_74;
  lzma_lzma1_encoder *local_70;
  uint8_t *local_68;
  ulong local_60;
  uint local_58;
  uint local_54;
  uint8_t *local_50;
  lzma_mf *local_48;
  ulong local_40;
  ulong local_38;
  
  local_74 = mf->nice_len;
  local_80 = back_res;
  local_70 = coder;
  if (mf->read_ahead == 1) {
    local_8c = coder->matches_count;
    local_40 = (ulong)coder->longest_match_length;
  }
  else {
    if (mf->read_ahead != 0) {
      __assert_fail("mf->read_ahead == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_fast.c"
                    ,0x20,
                    "void lzma_lzma_optimum_fast(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict)"
                   );
    }
    uVar5 = lzma_mf_find(mf,&local_8c,coder->matches);
    local_40 = CONCAT44(extraout_var,uVar5);
  }
  uVar9 = mf->read_pos;
  local_58 = (mf->write_pos - uVar9) + 1;
  uVar16 = 0x111;
  if (local_58 < 0x111) {
    uVar16 = local_58;
  }
  if (local_58 < 2) {
    *local_80 = 0xffffffff;
    *len_res = 1;
    return;
  }
  local_50 = mf->buffer + uVar9;
  psVar19 = (short *)(mf->buffer + ((ulong)uVar9 - 1));
  puVar14 = local_50 + -2;
  uVar8 = 0;
  uVar13 = 0;
  uVar17 = 0;
  uVar18 = 0;
  puVar12 = local_80;
  plVar15 = local_70;
  local_88 = len_res;
  local_68 = puVar14;
  local_48 = mf;
  do {
    plVar4 = local_48;
    bVar21 = false;
    if (*psVar19 == *(short *)(puVar14 + -(ulong)plVar15->reps[uVar8])) {
      uVar10 = 2;
      do {
        uVar9 = (uint)uVar10;
        if (uVar16 <= uVar9) {
          unaff_R13 = (ulong)uVar16;
          break;
        }
        lVar20 = *(long *)((long)psVar19 + uVar10);
        lVar1 = *(long *)((long)(puVar14 + -(ulong)plVar15->reps[uVar8]) + uVar10);
        uVar10 = lVar20 - lVar1;
        if (uVar10 == 0) {
          uVar9 = uVar9 + 8;
        }
        else {
          uVar2 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
            }
          }
          uVar9 = ((uint)(uVar2 >> 3) & 0x1fffffff) + uVar9;
          uVar3 = uVar16;
          if (uVar9 < uVar16) {
            uVar3 = uVar9;
          }
          unaff_R13 = (ulong)uVar3;
        }
        uVar10 = (ulong)uVar9;
      } while (lVar20 == lVar1);
      uVar9 = (uint)unaff_R13;
      puVar14 = local_68;
      local_60 = uVar13;
      if (uVar9 < local_74) {
        if ((uint)uVar17 < uVar9) {
          uVar18 = uVar8 & 0xffffffff;
          uVar17 = unaff_R13;
        }
        bVar21 = false;
        uVar17 = uVar17 & 0xffffffff;
      }
      else {
        *puVar12 = (uint32_t)uVar8;
        *len_res = uVar9;
        bVar21 = true;
        uVar9 = uVar9 - 1;
        unaff_R13 = (ulong)uVar9;
        if (uVar9 != 0) {
          local_54 = (uint)uVar18;
          local_38 = uVar17;
          (*local_48->skip)(local_48,uVar9);
          uVar18 = (ulong)local_54;
          plVar4->read_ahead = plVar4->read_ahead + uVar9;
          puVar12 = local_80;
          puVar14 = local_68;
          plVar15 = local_70;
          uVar13 = local_60;
          uVar17 = local_38;
          len_res = local_88;
        }
      }
    }
    plVar4 = local_48;
    if (bVar21) break;
    bVar21 = 2 < uVar8;
    uVar8 = uVar8 + 1;
    uVar13 = CONCAT71((int7)(uVar13 >> 8),bVar21);
  } while (uVar8 != 4);
  if ((uVar13 & 1) == 0) {
    return;
  }
  uVar9 = (uint)local_40;
  if (local_74 <= uVar9) {
    *puVar12 = plVar15->matches[local_8c - 1].dist + 4;
    *local_88 = uVar9;
    uVar5 = uVar9 - 1;
    goto joined_r0x00470e22;
  }
  uVar5 = 0;
  if (1 < uVar9) {
    uVar8 = (ulong)local_8c;
    uVar5 = plVar15->matches[local_8c - 1].dist;
    if (1 < uVar8) {
      puVar11 = &plVar15->matches[uVar8 - 2].dist;
      uVar13 = local_40;
      do {
        uVar16 = ((lzma_match *)(puVar11 + -1))->len;
        uVar9 = (uint)uVar13;
        if ((uVar9 != uVar16 + 1) || (uVar5 >> 7 <= *puVar11)) break;
        local_8c = (int)uVar8 - 1;
        uVar8 = (ulong)local_8c;
        uVar5 = *puVar11;
        puVar11 = puVar11 + -2;
        uVar13 = (ulong)uVar16;
        uVar9 = uVar16;
      } while (1 < local_8c);
    }
    uVar16 = 1;
    if (uVar5 < 0x80) {
      uVar16 = uVar9;
    }
    if (uVar9 == 2) {
      uVar9 = uVar16;
    }
  }
  uVar16 = (uint)uVar17;
  if ((1 < uVar16) &&
     (((uVar9 <= uVar16 + 1 || ((uVar9 <= uVar16 + 2 && (0x200 < uVar5)))) ||
      ((uVar9 <= uVar16 + 3 && (0x8000 < uVar5)))))) {
    *puVar12 = (uint32_t)uVar18;
    *local_88 = uVar16;
    uVar5 = uVar16 - 1;
    goto joined_r0x00470e22;
  }
  if ((local_58 == 2) || (uVar9 < 2)) {
    *puVar12 = 0xffffffff;
    goto LAB_00470e92;
  }
  uVar6 = lzma_mf_find(local_48,&plVar15->matches_count,plVar15->matches);
  puVar14 = local_50;
  local_70->longest_match_length = uVar6;
  if (1 < uVar6) {
    uVar16 = plVar15->matches[plVar15->matches_count - 1].dist;
    if ((uVar6 < uVar9) || (uVar5 <= uVar16)) {
      if (((uVar6 <= uVar9 + 1) && (uVar6 != uVar9 + 1 || uVar5 < uVar16 >> 7)) &&
         (((uVar9 < 3 || (uVar6 + 1 < uVar9)) || (uVar5 >> 7 <= uVar16)))) goto LAB_00470ede;
    }
LAB_00470e7f:
    *local_80 = 0xffffffff;
LAB_00470e92:
    *local_88 = 1;
    return;
  }
LAB_00470ede:
  __n = 2;
  if (2 < uVar9 - 1) {
    __n = (size_t)(uVar9 - 1);
  }
  lVar20 = 0;
  do {
    iVar7 = bcmp(local_50,puVar14 + (-1 - (ulong)local_70->reps[lVar20]),__n);
    if (iVar7 == 0) goto LAB_00470e7f;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  *local_80 = uVar5 + 4;
  *local_88 = uVar9;
  uVar5 = uVar9 - 2;
joined_r0x00470e22:
  if (uVar5 != 0) {
    (*plVar4->skip)(plVar4,uVar5);
    plVar4->read_ahead = plVar4->read_ahead + uVar5;
  }
  return;
}

Assistant:

extern void
lzma_lzma_optimum_fast(lzma_lzma1_encoder *restrict coder,
		lzma_mf *restrict mf,
		uint32_t *restrict back_res, uint32_t *restrict len_res)
{
	const uint32_t nice_len = mf->nice_len;

	uint32_t len_main;
	uint32_t matches_count;
	if (mf->read_ahead == 0) {
		len_main = mf_find(mf, &matches_count, coder->matches);
	} else {
		assert(mf->read_ahead == 1);
		len_main = coder->longest_match_length;
		matches_count = coder->matches_count;
	}

	const uint8_t *buf = mf_ptr(mf) - 1;
	const uint32_t buf_avail = my_min(mf_avail(mf) + 1, MATCH_LEN_MAX);

	if (buf_avail < 2) {
		// There's not enough input left to encode a match.
		*back_res = UINT32_MAX;
		*len_res = 1;
		return;
	}

	// Look for repeated matches; scan the previous four match distances
	uint32_t rep_len = 0;
	uint32_t rep_index = 0;

	for (uint32_t i = 0; i < REPS; ++i) {
		// Pointer to the beginning of the match candidate
		const uint8_t *const buf_back = buf - coder->reps[i] - 1;

		// If the first two bytes (2 == MATCH_LEN_MIN) do not match,
		// this rep is not useful.
		if (not_equal_16(buf, buf_back))
			continue;

		// The first two bytes matched.
		// Calculate the length of the match.
		const uint32_t len = lzma_memcmplen(
				buf, buf_back, 2, buf_avail);

		// If we have found a repeated match that is at least
		// nice_len long, return it immediately.
		if (len >= nice_len) {
			*back_res = i;
			*len_res = len;
			mf_skip(mf, len - 1);
			return;
		}

		if (len > rep_len) {
			rep_index = i;
			rep_len = len;
		}
	}

	// We didn't find a long enough repeated match. Encode it as a normal
	// match if the match length is at least nice_len.
	if (len_main >= nice_len) {
		*back_res = coder->matches[matches_count - 1].dist + REPS;
		*len_res = len_main;
		mf_skip(mf, len_main - 1);
		return;
	}

	uint32_t back_main = 0;
	if (len_main >= 2) {
		back_main = coder->matches[matches_count - 1].dist;

		while (matches_count > 1 && len_main ==
				coder->matches[matches_count - 2].len + 1) {
			if (!change_pair(coder->matches[
						matches_count - 2].dist,
					back_main))
				break;

			--matches_count;
			len_main = coder->matches[matches_count - 1].len;
			back_main = coder->matches[matches_count - 1].dist;
		}

		if (len_main == 2 && back_main >= 0x80)
			len_main = 1;
	}

	if (rep_len >= 2) {
		if (rep_len + 1 >= len_main
				|| (rep_len + 2 >= len_main
					&& back_main > (UINT32_C(1) << 9))
				|| (rep_len + 3 >= len_main
					&& back_main > (UINT32_C(1) << 15))) {
			*back_res = rep_index;
			*len_res = rep_len;
			mf_skip(mf, rep_len - 1);
			return;
		}
	}

	if (len_main < 2 || buf_avail <= 2) {
		*back_res = UINT32_MAX;
		*len_res = 1;
		return;
	}

	// Get the matches for the next byte. If we find a better match,
	// the current byte is encoded as a literal.
	coder->longest_match_length = mf_find(mf,
			&coder->matches_count, coder->matches);

	if (coder->longest_match_length >= 2) {
		const uint32_t new_dist = coder->matches[
				coder->matches_count - 1].dist;

		if ((coder->longest_match_length >= len_main
					&& new_dist < back_main)
				|| (coder->longest_match_length == len_main + 1
					&& !change_pair(back_main, new_dist))
				|| (coder->longest_match_length > len_main + 1)
				|| (coder->longest_match_length + 1 >= len_main
					&& len_main >= 3
					&& change_pair(new_dist, back_main))) {
			*back_res = UINT32_MAX;
			*len_res = 1;
			return;
		}
	}

	// In contrast to LZMA SDK, dictionary could not have been moved
	// between mf_find() calls, thus it is safe to just increment
	// the old buf pointer instead of recalculating it with mf_ptr().
	++buf;

	const uint32_t limit = my_max(2, len_main - 1);

	for (uint32_t i = 0; i < REPS; ++i) {
		if (memcmp(buf, buf - coder->reps[i] - 1, limit) == 0) {
			*back_res = UINT32_MAX;
			*len_res = 1;
			return;
		}
	}

	*back_res = back_main + REPS;
	*len_res = len_main;
	mf_skip(mf, len_main - 2);
	return;
}